

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectExpressions.cpp
# Opt level: O0

Expression *
slang::ast::ElementSelectExpression::fromConstant
          (Compilation *compilation,Expression *value,int32_t index,ASTContext *context)

{
  SourceRange exprRange;
  bool bVar1;
  Type *args;
  ElementSelectExpression *pEVar2;
  Type *in_RCX;
  undefined4 in_EDX;
  SourceLocation in_RSI;
  SourceLocation in_RDI;
  SourceRange in_stack_00000010;
  ElementSelectExpression *result;
  Type *resultType;
  Expression *indexExpr;
  undefined8 in_stack_ffffffffffffff48;
  Expression *expr;
  SVInt *in_stack_ffffffffffffff50;
  Compilation *compilation_00;
  SVInt *in_stack_ffffffffffffff60;
  Expression *args_1;
  BumpAllocator *in_stack_ffffffffffffff80;
  SVInt *in_stack_ffffffffffffff88;
  Compilation *in_stack_ffffffffffffff90;
  Expression **in_stack_ffffffffffffff98;
  ASTContext *in_stack_ffffffffffffffa0;
  Type *pTVar3;
  undefined4 in_stack_ffffffffffffffe0;
  SourceLocation SVar4;
  SourceLocation in_stack_fffffffffffffff8;
  undefined1 isRangeSelect;
  
  args_1 = (Expression *)&stack0xffffffffffffffc0;
  SVar4 = in_RDI;
  SVInt::SVInt<int>(in_stack_ffffffffffffff50,(int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
  args = (Type *)IntegerLiteral::fromConstant(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  SVInt::~SVInt(in_stack_ffffffffffffff60);
  pTVar3 = args;
  Expression::selfDetermined(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  isRangeSelect = (undefined1)((ulong)pTVar3 >> 0x38);
  pTVar3 = in_RCX;
  not_null<const_slang::ast::Type_*>::operator*((not_null<const_slang::ast::Type_*> *)0xbc39c6);
  expr = *(Expression **)((long)in_RSI + 0x20);
  compilation_00 = *(Compilation **)((long)in_RSI + 0x28);
  exprRange.endLoc = in_stack_fffffffffffffff8;
  exprRange.startLoc = SVar4;
  getIndexedType((Compilation *)in_RSI,(ASTContext *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0),
                 pTVar3,exprRange,in_stack_00000010,(bool)isRangeSelect);
  pEVar2 = BumpAllocator::
           emplace<slang::ast::ElementSelectExpression,slang::ast::Type_const&,slang::ast::Expression&,slang::ast::Expression&,slang::SourceRange&>
                     (in_stack_ffffffffffffff80,args,args_1,(Expression *)in_RDI,
                      (SourceRange *)in_RCX);
  bVar1 = Expression::bad((Expression *)compilation_00);
  if (((bVar1) || (bVar1 = Expression::bad((Expression *)compilation_00), bVar1)) ||
     (bVar1 = Expression::bad((Expression *)compilation_00), bVar1)) {
    pEVar2 = (ElementSelectExpression *)Expression::badExpr(compilation_00,expr);
  }
  return &pEVar2->super_Expression;
}

Assistant:

Expression& ElementSelectExpression::fromConstant(Compilation& compilation, Expression& value,
                                                  int32_t index, const ASTContext& context) {
    Expression* indexExpr = &IntegerLiteral::fromConstant(compilation, index);
    selfDetermined(context, indexExpr);

    const Type& resultType = getIndexedType(compilation, context, *value.type,
                                            indexExpr->sourceRange, value.sourceRange, false);

    auto result = compilation.emplace<ElementSelectExpression>(resultType, value, *indexExpr,
                                                               value.sourceRange);
    if (value.bad() || indexExpr->bad() || result->bad())
        return badExpr(compilation, result);

    return *result;
}